

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char16_t * __thiscall kj::Vector<char16_t>::add<unsigned_int>(Vector<char16_t> *this,uint *params)

{
  bool bVar1;
  uint *params_00;
  char16_t *pcVar2;
  uint *params_local;
  Vector<char16_t> *this_local;
  
  bVar1 = ArrayBuilder<char16_t>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<unsigned_int>(params);
  pcVar2 = ArrayBuilder<char16_t>::add<unsigned_int>(&this->builder,params_00);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }